

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQOuter::SQOuter(SQOuter *this,SQSharedState *ss,SQObjectPtr *outer)

{
  _func_int **in_RDX;
  SQSharedState *in_RSI;
  SQCollectable_conflict *in_RDI;
  SQCollectable *in_stack_ffffffffffffffd0;
  
  SQCollectable::SQCollectable(in_stack_ffffffffffffffd0);
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQOuter_001621f8;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&in_RDI[1].super_SQRefCounted._weakref);
  in_RDI[1].super_SQRefCounted._vptr_SQRefCounted = in_RDX;
  in_RDI[1]._prev = (SQCollectable_conflict *)0x0;
  in_RDI[1]._prev = (SQCollectable_conflict *)0x0;
  in_RDI->_prev = (SQCollectable_conflict *)0x0;
  in_RDI->_sharedstate = in_RSI;
  SQCollectable::AddToChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  return;
}

Assistant:

SQOuter(SQSharedState *ss, SQObjectPtr *outer){_valptr = outer; _next = NULL; INIT_CHAIN(); ADD_TO_CHAIN(&_ss(this)->_gc_chain,this); }